

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O1

void HTS_Engine_save_information(HTS_Engine *engine,FILE *fp)

{
  HTS_ModelSet *ms;
  double dVar1;
  double *pdVar2;
  HTS_PStreamSet *pHVar3;
  HTS_Boolean HVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  HTS_Label *label;
  char *pcVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  size_t n;
  size_t m;
  size_t local_70;
  HTS_Label *local_68;
  size_t local_60;
  HTS_PStreamSet *local_58;
  HTS_SStreamSet *local_50;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  
  fwrite("[Global parameter]\n",0x13,1,(FILE *)fp);
  fprintf((FILE *)fp,"Sampring frequency                     -> %8lu(Hz)\n",
          (engine->condition).sampling_frequency);
  fprintf((FILE *)fp,"Frame period                           -> %8lu(point)\n",
          (engine->condition).fperiod);
  sVar5 = (engine->condition).fperiod;
  sVar6 = (engine->condition).sampling_frequency;
  fprintf((FILE *)fp,"                                          %8.5f(msec)\n",
          ((((double)CONCAT44(0x45300000,(int)(sVar5 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) * 1000.0) /
          (((double)CONCAT44(0x45300000,(int)(sVar6 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)));
  fprintf((FILE *)fp,"All-pass constant                      -> %8.5f\n",
          (double)(float)(engine->condition).alpha);
  ms = &engine->ms;
  fprintf((FILE *)fp,"Gamma                                  -> %8.5f\n");
  if ((engine->condition).stage != 0) {
    pcVar8 = "Log gain flag                          ->    FALSE\n";
    if ((engine->condition).use_log_gain == '\x01') {
      pcVar8 = "Log gain flag                          ->     TRUE\n";
    }
    fwrite(pcVar8,0x33,1,(FILE *)fp);
  }
  fprintf((FILE *)fp,"Postfiltering coefficient              -> %8.5f\n",
          (double)(float)(engine->condition).beta);
  fprintf((FILE *)fp,"Audio buffer size                      -> %8lu(sample)\n",
          (engine->condition).audio_buff_size);
  fputc(10,(FILE *)fp);
  fwrite("[Duration parameter]\n",0x15,1,(FILE *)fp);
  sVar5 = HTS_ModelSet_get_nstate(ms);
  fprintf((FILE *)fp,"Number of states                       -> %8lu\n",sVar5);
  sVar5 = HTS_ModelSet_get_nvoices(ms);
  fprintf((FILE *)fp,"         Interpolation size            -> %8lu\n",sVar5);
  sVar5 = HTS_ModelSet_get_nvoices(ms);
  local_68 = (HTS_Label *)0x0;
  if (sVar5 != 0) {
    uVar9 = 0;
    local_68 = (HTS_Label *)0.0;
    do {
      local_68 = (HTS_Label *)((double)local_68 + (engine->condition).duration_iw[uVar9]);
      uVar9 = uVar9 + 1;
      sVar5 = HTS_ModelSet_get_nvoices(ms);
    } while (uVar9 < sVar5);
  }
  sVar5 = HTS_ModelSet_get_nvoices(ms);
  if (sVar5 != 0) {
    uVar9 = 0;
    do {
      pdVar2 = (engine->condition).duration_iw;
      dVar10 = pdVar2[uVar9];
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        pdVar2[uVar9] = dVar10 / (double)local_68;
      }
      uVar9 = uVar9 + 1;
      sVar5 = HTS_ModelSet_get_nvoices(ms);
    } while (uVar9 < sVar5);
  }
  sVar5 = HTS_ModelSet_get_nvoices(ms);
  if (sVar5 != 0) {
    uVar9 = 0;
    do {
      fprintf((FILE *)fp,"         Interpolation weight[%2lu]      -> %8.0f(%%)\n",
              (double)(float)((engine->condition).duration_iw[uVar9] * 100.0),uVar9);
      uVar9 = uVar9 + 1;
      sVar5 = HTS_ModelSet_get_nvoices(ms);
    } while (uVar9 < sVar5);
  }
  local_68 = &engine->label;
  local_58 = &engine->pss;
  fputc(10,(FILE *)fp);
  fwrite("[Stream parameter]\n",0x13,1,(FILE *)fp);
  sVar5 = HTS_ModelSet_get_nstream(ms);
  if (sVar5 != 0) {
    sVar5 = 0;
    do {
      sVar6 = HTS_ModelSet_get_vector_length(ms,sVar5);
      fprintf((FILE *)fp,"Stream[%2lu] vector length               -> %8lu\n",sVar5,sVar6);
      sVar6 = HTS_ModelSet_get_window_size(ms,sVar5);
      fprintf((FILE *)fp,"           Dynamic window size         -> %8lu\n",sVar6);
      sVar6 = HTS_ModelSet_get_nvoices(ms);
      fprintf((FILE *)fp,"           Interpolation size          -> %8lu\n",sVar6);
      sVar6 = HTS_ModelSet_get_nvoices(ms);
      dVar10 = 0.0;
      if (sVar6 != 0) {
        uVar9 = 0;
        do {
          dVar10 = dVar10 + (engine->condition).parameter_iw[uVar9][sVar5];
          uVar9 = uVar9 + 1;
          sVar6 = HTS_ModelSet_get_nvoices(ms);
        } while (uVar9 < sVar6);
      }
      sVar6 = HTS_ModelSet_get_nvoices(ms);
      if (sVar6 != 0) {
        uVar9 = 0;
        do {
          pdVar2 = (engine->condition).parameter_iw[uVar9];
          dVar1 = pdVar2[sVar5];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            pdVar2[sVar5] = dVar1 / dVar10;
          }
          uVar9 = uVar9 + 1;
          sVar6 = HTS_ModelSet_get_nvoices(ms);
        } while (uVar9 < sVar6);
      }
      sVar6 = HTS_ModelSet_get_nvoices(ms);
      if (sVar6 != 0) {
        uVar9 = 0;
        do {
          fprintf((FILE *)fp,"           Interpolation weight[%2lu]    -> %8.0f(%%)\n",
                  (double)(float)((engine->condition).parameter_iw[uVar9][sVar5] * 100.0),uVar9);
          uVar9 = uVar9 + 1;
          sVar6 = HTS_ModelSet_get_nvoices(ms);
        } while (uVar9 < sVar6);
      }
      HVar4 = HTS_ModelSet_is_msd(ms,sVar5);
      if (HVar4 == '\0') {
        fwrite("           MSD flag                    ->    FALSE\n",0x33,1,(FILE *)fp);
      }
      else {
        fwrite("           MSD flag                    ->     TRUE\n",0x33,1,(FILE *)fp);
        fprintf((FILE *)fp,"           MSD threshold               -> %8.5f\n",
                (engine->condition).msd_threshold[sVar5]);
      }
      HVar4 = HTS_ModelSet_use_gv(ms,sVar5);
      if (HVar4 == '\0') {
        fwrite("           GV flag                     ->    FALSE\n",0x33,1,(FILE *)fp);
      }
      else {
        fwrite("           GV flag                     ->     TRUE\n",0x33,1,(FILE *)fp);
        fprintf((FILE *)fp,"           GV weight                   -> %8.0f(%%)\n",
                (double)(float)((engine->condition).gv_weight[sVar5] * 100.0));
        sVar6 = HTS_ModelSet_get_nvoices(ms);
        fprintf((FILE *)fp,"           GV interpolation size       -> %8lu\n",sVar6);
        sVar6 = HTS_ModelSet_get_nvoices(ms);
        dVar10 = 0.0;
        if (sVar6 != 0) {
          uVar9 = 0;
          dVar10 = 0.0;
          do {
            dVar10 = dVar10 + (engine->condition).gv_iw[uVar9][sVar5];
            uVar9 = uVar9 + 1;
            sVar6 = HTS_ModelSet_get_nvoices(ms);
          } while (uVar9 < sVar6);
        }
        sVar6 = HTS_ModelSet_get_nvoices(ms);
        if (sVar6 != 0) {
          uVar9 = 0;
          do {
            pdVar2 = (engine->condition).gv_iw[uVar9];
            dVar1 = pdVar2[sVar5];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              pdVar2[sVar5] = dVar1 / dVar10;
            }
            uVar9 = uVar9 + 1;
            sVar6 = HTS_ModelSet_get_nvoices(ms);
          } while (uVar9 < sVar6);
        }
        sVar6 = HTS_ModelSet_get_nvoices(ms);
        if (sVar6 != 0) {
          uVar9 = 0;
          do {
            fprintf((FILE *)fp,"           GV interpolation weight[%2lu] -> %8.0f(%%)\n",
                    (double)(float)((engine->condition).gv_iw[uVar9][sVar5] * 100.0),uVar9);
            uVar9 = uVar9 + 1;
            sVar6 = HTS_ModelSet_get_nvoices(ms);
          } while (uVar9 < sVar6);
        }
      }
      sVar5 = sVar5 + 1;
      sVar6 = HTS_ModelSet_get_nstream(ms);
    } while (sVar5 < sVar6);
  }
  fputc(10,(FILE *)fp);
  fwrite("[Generated sequence]\n",0x15,1,(FILE *)fp);
  label = local_68;
  sVar5 = HTS_Label_get_size(local_68);
  fprintf((FILE *)fp,"Number of HMMs                         -> %8lu\n",sVar5);
  sVar5 = HTS_Label_get_size(label);
  sVar6 = HTS_ModelSet_get_nstate(ms);
  fprintf((FILE *)fp,"Number of stats                        -> %8lu\n",sVar5 * sVar6);
  pHVar3 = local_58;
  sVar7 = HTS_PStreamSet_get_total_frame(local_58);
  auVar11._8_4_ = (int)(sVar7 >> 0x20);
  auVar11._0_8_ = sVar7;
  auVar11._12_4_ = 0x45300000;
  sVar5 = (engine->condition).fperiod;
  auVar12._8_4_ = (int)(sVar5 >> 0x20);
  auVar12._0_8_ = sVar5;
  auVar12._12_4_ = 0x45300000;
  sVar6 = (engine->condition).sampling_frequency;
  auVar13._8_4_ = (int)(sVar6 >> 0x20);
  auVar13._0_8_ = sVar6;
  auVar13._12_4_ = 0x45300000;
  fprintf((FILE *)fp,"Length of this speech                  -> %8.3f(sec)\n",
          (double)(float)((((auVar12._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) *
                          ((auVar11._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0))) /
                         ((auVar13._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0))));
  sVar5 = HTS_PStreamSet_get_total_frame(pHVar3);
  fprintf((FILE *)fp,"                                       -> %8lu(frames)\n",
          sVar5 * (engine->condition).fperiod);
  sVar5 = HTS_Label_get_size(label);
  if (sVar5 != 0) {
    local_50 = &engine->sss;
    sVar5 = 0;
    do {
      fprintf((FILE *)fp,"HMM[%2lu]\n",sVar5);
      pcVar8 = HTS_Label_get_string(label,sVar5);
      fprintf((FILE *)fp,"  Name                                 -> %s\n",pcVar8);
      fwrite("  Duration\n",0xb,1,(FILE *)fp);
      sVar6 = HTS_ModelSet_get_nvoices(ms);
      if (sVar6 != 0) {
        sVar6 = 0;
        do {
          fprintf((FILE *)fp,"    Interpolation[%2lu]\n",sVar6);
          pcVar8 = HTS_Label_get_string(label,sVar5);
          HTS_ModelSet_get_duration_index(ms,sVar6,pcVar8,&local_70,&local_60);
          fprintf((FILE *)fp,"      Tree index                       -> %8lu\n",local_70);
          fprintf((FILE *)fp,"      PDF index                        -> %8lu\n",local_60);
          sVar6 = sVar6 + 1;
          sVar7 = HTS_ModelSet_get_nvoices(ms);
        } while (sVar6 < sVar7);
      }
      sVar6 = HTS_ModelSet_get_nstate(ms);
      if (sVar6 != 0) {
        uVar9 = 0;
        do {
          local_58 = (HTS_PStreamSet *)(uVar9 + 2);
          fprintf((FILE *)fp,"  State[%2lu]\n");
          sVar6 = HTS_ModelSet_get_nstate(ms);
          local_48 = uVar9;
          sVar6 = HTS_SStreamSet_get_duration(local_50,sVar6 * sVar5 + uVar9);
          fprintf((FILE *)fp,"    Length                             -> %8lu(frames)\n",sVar6);
          local_70 = 0;
          sVar6 = HTS_ModelSet_get_nstream(ms);
          if (sVar6 != 0) {
            do {
              fprintf((FILE *)fp,"    Stream[%2lu]\n",local_70);
              HVar4 = HTS_ModelSet_is_msd(ms,local_70);
              sVar6 = local_70;
              if (HVar4 != '\0') {
                sVar7 = HTS_ModelSet_get_nstate(ms);
                dVar10 = HTS_SStreamSet_get_msd(local_50,sVar6,sVar7 * sVar5 + local_48);
                pdVar2 = (engine->condition).msd_threshold + local_70;
                pcVar8 = "      MSD flag                         ->    FALSE\n";
                if (*pdVar2 <= dVar10 && dVar10 != *pdVar2) {
                  pcVar8 = "      MSD flag                         ->     TRUE\n";
                }
                fwrite(pcVar8,0x33,1,(FILE *)fp);
              }
              local_60 = 0;
              sVar6 = HTS_ModelSet_get_nvoices(ms);
              pHVar3 = local_58;
              if (sVar6 != 0) {
                do {
                  fprintf((FILE *)fp,"      Interpolation[%2lu]\n",local_60);
                  sVar7 = local_60;
                  sVar6 = local_70;
                  pcVar8 = HTS_Label_get_string(local_68,sVar5);
                  HTS_ModelSet_get_parameter_index
                            (ms,sVar7,sVar6,(size_t)pHVar3,pcVar8,&local_38,&local_40);
                  fprintf((FILE *)fp,"        Tree index                     -> %8lu\n",local_38);
                  fprintf((FILE *)fp,"        PDF index                      -> %8lu\n",local_40);
                  uVar9 = local_60 + 1;
                  local_60 = uVar9;
                  sVar6 = HTS_ModelSet_get_nvoices(ms);
                } while (uVar9 < sVar6);
              }
              uVar9 = local_70 + 1;
              local_70 = uVar9;
              sVar6 = HTS_ModelSet_get_nstream(ms);
            } while (uVar9 < sVar6);
          }
          uVar9 = local_48 + 1;
          sVar6 = HTS_ModelSet_get_nstate(ms);
        } while (uVar9 < sVar6);
      }
      label = local_68;
      sVar5 = sVar5 + 1;
      sVar6 = HTS_Label_get_size(local_68);
    } while (sVar5 < sVar6);
  }
  return;
}

Assistant:

void HTS_Engine_save_information(HTS_Engine * engine, FILE * fp)
{
   size_t i, j, k, l, m, n;
   double temp;
   HTS_Condition *condition = &engine->condition;
   HTS_ModelSet *ms = &engine->ms;
   HTS_Label *label = &engine->label;
   HTS_SStreamSet *sss = &engine->sss;
   HTS_PStreamSet *pss = &engine->pss;

   /* global parameter */
   fprintf(fp, "[Global parameter]\n");
   fprintf(fp, "Sampring frequency                     -> %8lu(Hz)\n", (unsigned long) condition->sampling_frequency);
   fprintf(fp, "Frame period                           -> %8lu(point)\n", (unsigned long) condition->fperiod);
   fprintf(fp, "                                          %8.5f(msec)\n", 1e+3 * condition->fperiod / condition->sampling_frequency);
   fprintf(fp, "All-pass constant                      -> %8.5f\n", (float) condition->alpha);
   fprintf(fp, "Gamma                                  -> %8.5f\n", (float) (condition->stage == 0 ? 0.0 : -1.0 / condition->stage));
   if (condition->stage != 0) {
      if (condition->use_log_gain == TRUE)
         fprintf(fp, "Log gain flag                          ->     TRUE\n");
      else
         fprintf(fp, "Log gain flag                          ->    FALSE\n");
   }
   fprintf(fp, "Postfiltering coefficient              -> %8.5f\n", (float) condition->beta);
   fprintf(fp, "Audio buffer size                      -> %8lu(sample)\n", (unsigned long) condition->audio_buff_size);
   fprintf(fp, "\n");

   /* duration parameter */
   fprintf(fp, "[Duration parameter]\n");
   fprintf(fp, "Number of states                       -> %8lu\n", (unsigned long) HTS_ModelSet_get_nstate(ms));
   fprintf(fp, "         Interpolation size            -> %8lu\n", (unsigned long) HTS_ModelSet_get_nvoices(ms));
   /* check interpolation */
   for (i = 0, temp = 0.0; i < HTS_ModelSet_get_nvoices(ms); i++)
      temp += condition->duration_iw[i];
   for (i = 0; i < HTS_ModelSet_get_nvoices(ms); i++)
      if (condition->duration_iw[i] != 0.0)
         condition->duration_iw[i] /= temp;
   for (i = 0; i < HTS_ModelSet_get_nvoices(ms); i++)
      fprintf(fp, "         Interpolation weight[%2lu]      -> %8.0f(%%)\n", (unsigned long) i, (float) (100 * condition->duration_iw[i]));
   fprintf(fp, "\n");

   fprintf(fp, "[Stream parameter]\n");
   for (i = 0; i < HTS_ModelSet_get_nstream(ms); i++) {
      /* stream parameter */
      fprintf(fp, "Stream[%2lu] vector length               -> %8lu\n", (unsigned long) i, (unsigned long) HTS_ModelSet_get_vector_length(ms, i));
      fprintf(fp, "           Dynamic window size         -> %8lu\n", (unsigned long) HTS_ModelSet_get_window_size(ms, i));
      /* interpolation */
      fprintf(fp, "           Interpolation size          -> %8lu\n", (unsigned long) HTS_ModelSet_get_nvoices(ms));
      for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
         temp += condition->parameter_iw[j][i];
      for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
         if (condition->parameter_iw[j][i] != 0.0)
            condition->parameter_iw[j][i] /= temp;
      for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
         fprintf(fp, "           Interpolation weight[%2lu]    -> %8.0f(%%)\n", (unsigned long) j, (float) (100 * condition->parameter_iw[j][i]));
      /* MSD */
      if (HTS_ModelSet_is_msd(ms, i)) { /* for MSD */
         fprintf(fp, "           MSD flag                    ->     TRUE\n");
         fprintf(fp, "           MSD threshold               -> %8.5f\n", condition->msd_threshold[i]);
      } else {                  /* for non MSD */
         fprintf(fp, "           MSD flag                    ->    FALSE\n");
      }
      /* GV */
      if (HTS_ModelSet_use_gv(ms, i)) {
         fprintf(fp, "           GV flag                     ->     TRUE\n");
         fprintf(fp, "           GV weight                   -> %8.0f(%%)\n", (float) (100 * condition->gv_weight[i]));
         fprintf(fp, "           GV interpolation size       -> %8lu\n", (unsigned long) HTS_ModelSet_get_nvoices(ms));
         /* interpolation */
         for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
            temp += condition->gv_iw[j][i];
         for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
            if (condition->gv_iw[j][i] != 0.0)
               condition->gv_iw[j][i] /= temp;
         for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
            fprintf(fp, "           GV interpolation weight[%2lu] -> %8.0f(%%)\n", (unsigned long) j, (float) (100 * condition->gv_iw[j][i]));
      } else {
         fprintf(fp, "           GV flag                     ->    FALSE\n");
      }
   }
   fprintf(fp, "\n");

   /* generated sequence */
   fprintf(fp, "[Generated sequence]\n");
   fprintf(fp, "Number of HMMs                         -> %8lu\n", (unsigned long) HTS_Label_get_size(label));
   fprintf(fp, "Number of stats                        -> %8lu\n", (unsigned long) HTS_Label_get_size(label) * HTS_ModelSet_get_nstate(ms));
   fprintf(fp, "Length of this speech                  -> %8.3f(sec)\n", (float) ((double) HTS_PStreamSet_get_total_frame(pss) * condition->fperiod / condition->sampling_frequency));
   fprintf(fp, "                                       -> %8lu(frames)\n", (unsigned long) HTS_PStreamSet_get_total_frame(pss) * condition->fperiod);

   for (i = 0; i < HTS_Label_get_size(label); i++) {
      fprintf(fp, "HMM[%2lu]\n", (unsigned long) i);
      fprintf(fp, "  Name                                 -> %s\n", HTS_Label_get_string(label, i));
      fprintf(fp, "  Duration\n");
      for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++) {
         fprintf(fp, "    Interpolation[%2lu]\n", (unsigned long) j);
         HTS_ModelSet_get_duration_index(ms, j, HTS_Label_get_string(label, i), &k, &l);
         fprintf(fp, "      Tree index                       -> %8lu\n", (unsigned long) k);
         fprintf(fp, "      PDF index                        -> %8lu\n", (unsigned long) l);
      }
      for (j = 0; j < HTS_ModelSet_get_nstate(ms); j++) {
         fprintf(fp, "  State[%2lu]\n", (unsigned long) j + 2);
         fprintf(fp, "    Length                             -> %8lu(frames)\n", (unsigned long) HTS_SStreamSet_get_duration(sss, i * HTS_ModelSet_get_nstate(ms) + j));
         for (k = 0; k < HTS_ModelSet_get_nstream(ms); k++) {
            fprintf(fp, "    Stream[%2lu]\n", (unsigned long) k);
            if (HTS_ModelSet_is_msd(ms, k)) {
               if (HTS_SStreamSet_get_msd(sss, k, i * HTS_ModelSet_get_nstate(ms) + j) > condition->msd_threshold[k])
                  fprintf(fp, "      MSD flag                         ->     TRUE\n");
               else
                  fprintf(fp, "      MSD flag                         ->    FALSE\n");
            }
            for (l = 0; l < HTS_ModelSet_get_nvoices(ms); l++) {
               fprintf(fp, "      Interpolation[%2lu]\n", (unsigned long) l);
               HTS_ModelSet_get_parameter_index(ms, l, k, j + 2, HTS_Label_get_string(label, i), &m, &n);
               fprintf(fp, "        Tree index                     -> %8lu\n", (unsigned long) m);
               fprintf(fp, "        PDF index                      -> %8lu\n", (unsigned long) n);
            }
         }
      }
   }
}